

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O0

int Io_ReadPlaRemoveMarked(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  int iVar1;
  int local_28;
  int local_24;
  int c;
  int c1;
  Vec_Bit_t *vMarks_local;
  int nWords_local;
  int nCubes_local;
  word **pCs_local;
  
  local_28 = 0;
  for (local_24 = 0; local_24 < nCubes; local_24 = local_24 + 1) {
    iVar1 = Vec_BitEntry(vMarks,local_24);
    if (iVar1 == 0) {
      if (local_28 != local_24) {
        Abc_TtCopy(pCs[local_28],pCs[local_24],nWords,0);
      }
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

int Io_ReadPlaRemoveMarked( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c;
    for ( c1 = c = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
        {
            if ( c == c1 )
                c++;
            else
                Abc_TtCopy( pCs[c++], pCs[c1], nWords, 0 );
        }
    return c;
}